

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O1

void __thiscall
fizplex::Base::Base(Base *this,LP *lp,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *basic_indices)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *__x;
  ulong uVar6;
  ETM local_48;
  
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DVector::DVector(&this->work,
                   (long)(basic_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(basic_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3);
  uVar3 = (long)(basic_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(basic_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)uVar3 >> 3;
  this->m = uVar6;
  uVar3 = -(ulong)(uVar6 >> 0x3d != 0) | uVar3;
  puVar4 = (unsigned_long *)operator_new__(uVar3);
  memset(puVar4,0,uVar3);
  (this->row_ordering)._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = puVar4;
  puVar1 = (basic_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (basic_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  sVar5 = LP::row_count(lp);
  if ((long)puVar2 - (long)puVar1 >> 3 == sVar5) {
    if (this->m != 0) {
      uVar3 = 0;
      do {
        __x = &ColMatrix::column(&lp->A,(basic_indices->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar3])->values;
        std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
                  ((vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *)
                   &local_48,__x);
        local_48.col = uVar3;
        std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::
        emplace_back<fizplex::Base::ETM>(&this->etms,&local_48);
        if (local_48.eta.values.
            super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.eta.values.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.eta.values.
                                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.eta.values.
                                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->m);
    }
    if (this->m != 0) {
      puVar4 = (this->row_ordering)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      uVar3 = 0;
      do {
        puVar4[uVar3] = uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->m);
    }
    invert(this);
    return;
  }
  __assert_fail("basic_indices.size() == lp.row_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base.cc"
                ,0x13,"fizplex::Base::Base(const LP &, const std::vector<size_t> &)");
}

Assistant:

Base::Base(const LP &lp, const std::vector<size_t> &basic_indices)
    : work(basic_indices.size()), m(basic_indices.size()),
      row_ordering(std::make_unique<size_t[]>(m)) {
  assert(basic_indices.size() == lp.row_count());
  for (size_t i = 0; i < m; i++)
    etms.push_back(ETM(lp.A.column(basic_indices[i]), i));
  for (size_t i = 0; i < m; i++)
    row_ordering[i] = i;
  invert();
}